

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_name(uchar **p,uchar *end,mbedtls_x509_name *cur)

{
  int iVar1;
  uchar *end_00;
  mbedtls_asn1_named_data *pmVar2;
  uchar *end_set;
  size_t set_len;
  mbedtls_x509_name *pmStack_28;
  int ret;
  mbedtls_x509_name *cur_local;
  uchar *end_local;
  uchar **p_local;
  
  pmStack_28 = cur;
  cur_local = (mbedtls_x509_name *)end;
  end_local = (uchar *)p;
  while( true ) {
    iVar1 = mbedtls_asn1_get_tag((uchar **)end_local,(uchar *)cur_local,(size_t *)&end_set,0x31);
    if (iVar1 != 0) {
      return iVar1 + -0x2380;
    }
    end_00 = end_set + *(long *)end_local;
    set_len._4_4_ = 0;
    while( true ) {
      set_len._4_4_ = x509_get_attr_type_value((uchar **)end_local,end_00,pmStack_28);
      if (set_len._4_4_ != 0) {
        return set_len._4_4_;
      }
      if (*(uchar **)end_local == end_00) break;
      pmStack_28->next_merged = '\x01';
      pmVar2 = (mbedtls_asn1_named_data *)calloc(1,0x40);
      pmStack_28->next = pmVar2;
      if (pmStack_28->next == (mbedtls_asn1_named_data *)0x0) {
        return -0x2880;
      }
      pmStack_28 = pmStack_28->next;
    }
    if (*(mbedtls_x509_name **)end_local == cur_local) {
      return 0;
    }
    pmVar2 = (mbedtls_asn1_named_data *)calloc(1,0x40);
    pmStack_28->next = pmVar2;
    if (pmStack_28->next == (mbedtls_asn1_named_data *)0x0) break;
    pmStack_28 = pmStack_28->next;
  }
  return -0x2880;
}

Assistant:

int mbedtls_x509_get_name( unsigned char **p, const unsigned char *end,
                   mbedtls_x509_name *cur )
{
    int ret;
    size_t set_len;
    const unsigned char *end_set;

    /* don't use recursion, we'd risk stack overflow if not optimized */
    while( 1 )
    {
        /*
         * parse SET
         */
        if( ( ret = mbedtls_asn1_get_tag( p, end, &set_len,
                MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SET ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_NAME + ret );

        end_set  = *p + set_len;

        while( 1 )
        {
            if( ( ret = x509_get_attr_type_value( p, end_set, cur ) ) != 0 )
                return( ret );

            if( *p == end_set )
                break;

            /* Mark this item as being no the only one in a set */
            cur->next_merged = 1;

            cur->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_name ) );

            if( cur->next == NULL )
                return( MBEDTLS_ERR_X509_ALLOC_FAILED );

            cur = cur->next;
        }

        /*
         * continue until end of SEQUENCE is reached
         */
        if( *p == end )
            return( 0 );

        cur->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_name ) );

        if( cur->next == NULL )
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );

        cur = cur->next;
    }
}